

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O3

int __thiscall deqp::egl::anon_unknown_0::BufferAgeTest::init(BufferAgeTest *this,EVP_PKEY_CTX *ctx)

{
  Functions *dst;
  NativeDisplay *pNVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  Visibility VVar5;
  int iVar6;
  deUint32 dVar7;
  GLuint GVar8;
  GLenum err;
  Library *egl;
  EGLDisplay pvVar9;
  Library *pLVar10;
  FilterList *this_00;
  EGLConfig pvVar11;
  NativeWindowFactory *pNVar12;
  undefined4 extraout_var;
  EGLSurface pvVar13;
  undefined4 extraout_var_00;
  GLES2Renderer *pGVar14;
  pointer pcVar15;
  ReferenceRenderer *pRVar16;
  NotSupportedError *this_01;
  long lVar17;
  size_type __dnew;
  size_type __dnew_1;
  EGLint attribList [3];
  value_type local_150;
  value_type local_130;
  size_type local_110;
  undefined1 local_108 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0 [5];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_78;
  undefined1 local_58 [40];
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar9 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_eglDisplay = pvVar9;
  pLVar10 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar9 = this->m_eglDisplay;
  bVar4 = this->m_preserveColorBuffer;
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (pointer)0x0;
  local_108._16_8_ = (pointer)0x0;
  this_00 = eglu::FilterList::operator<<((FilterList *)local_108,isWindow);
  eglu::FilterList::operator<<(this_00,isES2Renderable);
  if (bVar4 != false) {
    eglu::FilterList::operator<<((FilterList *)local_108,hasPreserveSwap);
  }
  pvVar11 = eglu::chooseSingleConfig(pLVar10,pvVar9,(FilterList *)local_108);
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
  }
  this->m_eglConfig = pvVar11;
  if (pvVar11 == (EGLConfig)0x0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"No supported config found",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
               ,0x188);
  }
  else {
    pNVar12 = eglu::selectNativeWindowFactory
                        (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine
                        );
    pvVar9 = this->m_eglDisplay;
    pNVar1 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
             ptr;
    VVar5 = eglu::parseWindowVisibility
                      (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
    local_108._0_8_ = (pointer)0x1e0000001e0;
    local_108._8_4_ = VVar5;
    iVar6 = (*(pNVar12->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                      (pNVar12,pNVar1,pvVar9,pvVar11,0,local_108);
    this->m_window = (NativeWindow *)CONCAT44(extraout_var,iVar6);
    pvVar13 = eglu::createWindowSurface
                        ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                         super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                         .m_data.ptr,(NativeWindow *)CONCAT44(extraout_var,iVar6),this->m_eglDisplay
                         ,pvVar11,(EGLAttrib *)0x0);
    this->m_eglSurface = pvVar13;
    pvVar11 = this->m_eglConfig;
    pLVar10 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    local_108._0_8_ = (pointer)0x200003098;
    local_108._8_4_ = 0x3038;
    (**pLVar10->_vptr_Library)(pLVar10,0x30a0);
    iVar6 = (*pLVar10->_vptr_Library[6])(pLVar10,this->m_eglDisplay,pvVar11,0,local_108);
    this->m_eglContext = (EGLContext)CONCAT44(extraout_var_00,iVar6);
    dVar7 = (*pLVar10->_vptr_Library[0x1f])(pLVar10);
    eglu::checkError(dVar7,"eglCreateContext",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                     ,0x1cb);
    (*pLVar10->_vptr_Library[0x27])
              (pLVar10,this->m_eglDisplay,this->m_eglSurface,this->m_eglSurface,this->m_eglContext);
    dVar7 = (*pLVar10->_vptr_Library[0x1f])(pLVar10);
    eglu::checkError(dVar7,"eglMakeCurrent",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                     ,0x1ce);
    dst = &this->m_gl;
    EglTestContext::initGLFunctions((this->super_TestCase).m_eglTestCtx,dst,(ApiType)0x2);
    pvVar9 = this->m_eglDisplay;
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"EGL_EXT_buffer_age","");
    bVar4 = eglu::hasExtension(egl,pvVar9,(string *)local_108);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if (bVar4) {
      pGVar14 = (GLES2Renderer *)operator_new(0xe0);
      pGVar14->m_gl = dst;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      local_150._M_dataplus._M_p = (pointer)0x99;
      pcVar15 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_130,(ulong)&local_150);
      _Var2._M_p = local_150._M_dataplus._M_p;
      local_130.field_2._M_allocated_capacity = (size_type)local_150._M_dataplus._M_p;
      local_130._M_dataplus._M_p = pcVar15;
      memcpy(pcVar15,
             "attribute mediump vec4 a_pos;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = a_pos;\n}"
             ,0x99);
      local_130._M_string_length = (size_type)_Var2._M_p;
      pcVar15[_Var2._M_p] = '\0';
      local_110 = 0x4a;
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      pcVar15 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_150,(ulong)&local_110);
      sVar3 = local_110;
      local_150.field_2._M_allocated_capacity = local_110;
      local_150._M_dataplus._M_p = pcVar15;
      memcpy(pcVar15,
             "varying mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_FragColor = v_color;\n}",0x4a)
      ;
      local_150._M_string_length = sVar3;
      pcVar15[sVar3] = '\0';
      memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_108,0,0xac);
      local_58._0_8_ = (pointer)0x0;
      local_58[8] = 0;
      local_58._9_7_ = 0;
      local_58[0x10] = 0;
      local_58._17_8_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_108,&local_130);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_f0,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,
                        (ulong)(local_130.field_2._M_allocated_capacity + 1));
      }
      glu::ShaderProgram::ShaderProgram(&pGVar14->m_glProgram,dst,(ProgramSources *)local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_58);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_78);
      lVar17 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_108 + lVar17));
        lVar17 = lVar17 + -0x18;
      } while (lVar17 != -0x18);
      pGVar14->m_coordLoc = 0xffffffff;
      pGVar14->m_colorLoc = 0xffffffff;
      GVar8 = (*pGVar14->m_gl->getAttribLocation)
                        ((pGVar14->m_glProgram).m_program.m_program,"a_color");
      pGVar14->m_colorLoc = GVar8;
      GVar8 = (*pGVar14->m_gl->getAttribLocation)
                        ((pGVar14->m_glProgram).m_program.m_program,"a_pos");
      pGVar14->m_coordLoc = GVar8;
      err = (*pGVar14->m_gl->getError)();
      glu::checkError(err,"Failed to get attribute locations",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                      ,0xfb);
      this->m_gles2Renderer = pGVar14;
      pRVar16 = (ReferenceRenderer *)operator_new(1);
      this->m_refRenderer = pRVar16;
      return (int)pRVar16;
    }
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"EGL_EXT_buffer_age is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
               ,0x191);
  }
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BufferAgeTest::init (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	m_eglDisplay = eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig	 = getEGLConfig(m_eglTestCtx.getLibrary(), m_eglDisplay, m_preserveColorBuffer);

	if (m_eglConfig == DE_NULL)
		TCU_THROW(NotSupportedError, "No supported config found");

	//create surface and context and make them current
	initEGLSurface(m_eglConfig);
	initEGLContext(m_eglConfig);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));

	if (eglu::hasExtension(egl, m_eglDisplay, "EGL_EXT_buffer_age") == false)
		TCU_THROW(NotSupportedError, "EGL_EXT_buffer_age is not supported");

	m_gles2Renderer = new GLES2Renderer(m_gl);
	m_refRenderer   = new ReferenceRenderer();
}